

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

string * __thiscall
QPDFWriter::getFinalVersion_abi_cxx11_(string *__return_storage_ptr__,QPDFWriter *this)

{
  doWriteSetup(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->final_pdf_version);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFWriter::getFinalVersion()
{
    doWriteSetup();
    return m->final_pdf_version;
}